

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

Result __thiscall
testing::internal::FunctionMocker<void_()>::PerformDefaultAction
          (FunctionMocker<void_()> *this,ArgumentTuple *args,string *call_description)

{
  OnCallSpec<void_()> *this_00;
  long *plVar1;
  pointer pcVar2;
  char cVar3;
  Action<void_()> *pAVar4;
  __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
  __tmp;
  pointer ppvVar5;
  string message;
  undefined **local_58;
  undefined8 local_50;
  undefined *local_48 [2];
  string *local_38;
  
  ppvVar5 = (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
            super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_38 = call_description;
  do {
    if (ppvVar5 ==
        (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
        super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      pcVar2 = (local_38->_M_dataplus)._M_p;
      local_58 = local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,pcVar2,pcVar2 + local_38->_M_string_length);
      std::__cxx11::string::append((char *)&local_58);
      if (local_58 == local_48) {
        return;
      }
      operator_delete(local_58,(ulong)(local_48[0] + 1));
      return;
    }
    this_00 = (OnCallSpec<void_()> *)ppvVar5[-1];
    ppvVar5 = ppvVar5 + -1;
    local_50 = 0;
    local_58 = &PTR__MatchResultListener_001578e0;
    plVar1 = *(long **)(this_00 + 0x20);
    cVar3 = (**(code **)(*plVar1 + 0x20))(plVar1,args,&local_58);
  } while (cVar3 == '\0');
  pAVar4 = OnCallSpec<void_()>::GetAction(this_00);
  Action<void_()>::Perform(pAVar4);
  return;
}

Assistant:

Result PerformDefaultAction(ArgumentTuple&& args,
                              const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != nullptr) {
      return spec->GetAction().Perform(std::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }